

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_exception.hpp
# Opt level: O2

void __thiscall
duckdb::CatalogException::
CatalogException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (CatalogException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  undefined8 uVar1;
  _Alloc_hider in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in_stack_ffffffffffffff00;
  string local_c8;
  string local_a8;
  string local_88 [32];
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string((string *)&local_c8,(string *)params);
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff18,(string *)params_1);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffef8,(string *)params_2);
  ::std::__cxx11::string::string((string *)&stack0xfffffffffffffed8,(string *)params_3);
  ::std::__cxx11::string::string((string *)&local_48,(string *)params_4._M_dataplus._M_p);
  ::std::__cxx11::string::string(local_68,(string *)params_4._M_string_length);
  uVar1 = 0x1615aa3;
  ::std::__cxx11::string::string(local_88,(string *)params_4.field_2._M_allocated_capacity);
  params_4_00._M_string_length = (size_type)local_88;
  params_4_00._M_dataplus._M_p = (pointer)local_68;
  params_4_00.field_2._M_allocated_capacity = uVar1;
  params_4_00.field_2._8_8_ = in_stack_fffffffffffffed8._M_p;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_a8,(Exception *)msg,&local_c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffed8,&local_48,params_4_00,in_stack_fffffffffffffee0,
             in_stack_ffffffffffffff00);
  CatalogException(this,&local_a8);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string(local_88);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  ::std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

explicit CatalogException(const string &msg, ARGS... params) : CatalogException(ConstructMessage(msg, params...)) {
	}